

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O1

void __thiscall lzham::symbol_codec::arith_start_encoding(symbol_codec *this)

{
  if ((this->m_arith_output_buf).m_size != 0) {
    (this->m_arith_output_buf).m_size = 0;
  }
  this->m_arith_base = 0;
  this->m_arith_value = 0;
  this->m_arith_length = 0xffffffff;
  this->m_arith_total_bits = 0;
  return;
}

Assistant:

inline bool try_resize(uint new_size, bool grow_hint = false)
      {
         if (m_size != new_size)
         {
            if (new_size < m_size)
               scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
            else
            {
               if (new_size > m_capacity)
               {
                  if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
                     return false;
               }

               scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
            }

            m_size = new_size;
         }

         return true;
      }